

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O1

string * __thiscall
BmsOutOfRangeAccessException::Message_abi_cxx11_
          (string *__return_storage_ptr__,BmsOutOfRangeAccessException *this)

{
  size_t sVar1;
  char *pcVar2;
  stringstream os;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  pcVar2 = *(char **)((this->super_BmsWithCauseClassException).klass_ + 8);
  pcVar2 = pcVar2 + (*pcVar2 == '*');
  sVar1 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,pcVar2,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"  - Tried to access over supporting range of BMS file format.",0x3d);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string
BmsOutOfRangeAccessException::Message( void ) const
{
  std::stringstream os;
  os << this->GetCauseClass().name() << "  - Tried to access over supporting range of BMS file format.";
  return os.str();
}